

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong *puVar7;
  size_t sVar8;
  uint uVar9;
  U32 UVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  BYTE *pBVar14;
  BYTE *ip;
  BYTE *pBVar15;
  seqDef *psVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int *piVar21;
  BYTE *pInLoopLimit;
  bool bVar22;
  size_t offsetFound;
  uint local_ac;
  size_t local_a8;
  int *local_a0;
  ulong *local_98;
  int *local_90;
  ZSTD_compressionParameters *local_88;
  uint local_7c;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  ZSTD_matchState_t *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  local_98 = (ulong *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_38 = (ms->window).base + (ms->window).dictLimit;
  local_4c = rep[1];
  piVar21 = (int *)((ulong)(local_38 == (BYTE *)src) + (long)src);
  local_50 = (int)piVar21 - (int)local_38;
  uVar19 = (ulong)local_4c;
  if (local_50 < local_4c) {
    uVar19 = 0;
  }
  uVar5 = (uint)uVar19;
  local_54 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_ac = local_54;
  if (local_50 < local_54) {
    local_ac = 0;
  }
  local_40 = rep;
  if (piVar21 < local_90) {
    puVar1 = (ulong *)((long)local_98 - 7);
    local_70 = (ulong *)((long)local_98 + -3);
    local_78 = (ulong *)((long)local_98 + -1);
    local_88 = cParams;
    local_60 = ms;
    local_48 = seqStore;
    do {
      local_a0 = (int *)((long)piVar21 + 1);
      local_68 = -(ulong)local_ac;
      if (local_ac == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        if (*(int *)((long)piVar21 + 1) == *(int *)((long)local_a0 - (ulong)local_ac)) {
          puVar2 = (ulong *)((long)piVar21 + 5);
          puVar11 = (ulong *)((long)piVar21 + local_68 + 5);
          puVar7 = puVar2;
          if (puVar2 < puVar1) {
            if (*puVar11 == *puVar2) {
              lVar12 = 0;
              do {
                puVar7 = (ulong *)((long)piVar21 + lVar12 + 0xd);
                if (puVar1 <= puVar7) {
                  puVar11 = (ulong *)((long)piVar21 + local_68 + lVar12 + 0xd);
                  puVar7 = (ulong *)((long)piVar21 + lVar12 + 0xd);
                  goto LAB_00163b65;
                }
                uVar13 = *(ulong *)((long)piVar21 + lVar12 + local_68 + 0xd);
                uVar18 = *puVar7;
                lVar12 = lVar12 + 8;
              } while (uVar13 == uVar18);
              uVar18 = uVar18 ^ uVar13;
              uVar13 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar12;
            }
            else {
              uVar18 = *puVar2 ^ *puVar11;
              uVar13 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00163b65:
            if ((puVar7 < local_70) && ((int)*puVar11 == (int)*puVar7)) {
              puVar7 = (ulong *)((long)puVar7 + 4);
              puVar11 = (ulong *)((long)puVar11 + 4);
            }
            if ((puVar7 < local_78) && ((short)*puVar11 == (short)*puVar7)) {
              puVar7 = (ulong *)((long)puVar7 + 2);
              puVar11 = (ulong *)((long)puVar11 + 2);
            }
            if (puVar7 < local_98) {
              puVar7 = (ulong *)((long)puVar7 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar7));
            }
            uVar13 = (long)puVar7 - (long)puVar2;
          }
          uVar13 = uVar13 + 4;
        }
      }
      local_7c = (uint)uVar19;
      local_a8 = 99999999;
      uVar5 = local_88->searchLength - 5;
      UVar10 = 4;
      if (uVar5 < 3) {
        UVar10 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
      }
      sVar6 = ZSTD_BtFindBestMatch
                        (local_60,local_88,(BYTE *)piVar21,(BYTE *)local_98,&local_a8,UVar10);
      uVar18 = uVar13;
      if (uVar13 < sVar6) {
        uVar18 = sVar6;
      }
      if (uVar18 < 4) {
        piVar21 = (int *)((long)piVar21 + ((long)piVar21 - (long)src >> 8) + 1);
        uVar19 = (ulong)local_7c;
      }
      else {
        piVar3 = piVar21;
        if (sVar6 <= uVar13) {
          local_a8 = 0;
          piVar3 = local_a0;
        }
        local_a0 = piVar3;
        sVar6 = local_a8;
        if (piVar21 < local_90) {
          do {
            piVar3 = (int *)((long)piVar21 + 1);
            if (sVar6 == 0) {
              sVar6 = 0;
            }
            else if ((local_ac != 0) && (*piVar3 == *(int *)((long)piVar3 + local_68))) {
              puVar2 = (ulong *)((long)piVar21 + 5);
              puVar11 = (ulong *)((long)piVar21 + local_68 + 5);
              puVar7 = puVar2;
              if (puVar2 < puVar1) {
                if (*puVar11 == *puVar2) {
                  puVar7 = (ulong *)((long)piVar21 + 0xd);
                  do {
                    if (puVar1 <= puVar7) {
                      puVar11 = (ulong *)((long)puVar7 + local_68);
                      goto LAB_00163cec;
                    }
                    puVar11 = (ulong *)((long)puVar7 + local_68);
                    uVar19 = *puVar7;
                    puVar7 = puVar7 + 1;
                  } while (*puVar11 == uVar19);
                  uVar19 = uVar19 ^ *puVar11;
                  uVar13 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  puVar7 = (ulong *)((long)puVar7 + ((uVar13 >> 3 & 0x1fffffff) - 8));
                  goto LAB_00163d2a;
                }
                uVar13 = *puVar2 ^ *puVar11;
                uVar19 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = uVar19 >> 3 & 0x1fffffff;
              }
              else {
LAB_00163cec:
                if ((puVar7 < local_70) && ((int)*puVar11 == (int)*puVar7)) {
                  puVar7 = (ulong *)((long)puVar7 + 4);
                  puVar11 = (ulong *)((long)puVar11 + 4);
                }
                if ((puVar7 < local_78) && ((short)*puVar11 == (short)*puVar7)) {
                  puVar7 = (ulong *)((long)puVar7 + 2);
                  puVar11 = (ulong *)((long)puVar11 + 2);
                }
                if (puVar7 < local_98) {
                  puVar7 = (ulong *)((long)puVar7 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar7));
                }
LAB_00163d2a:
                uVar19 = (long)puVar7 - (long)puVar2;
                if (0xfffffffffffffffb < uVar19) goto LAB_00163d5c;
              }
              uVar9 = (int)sVar6 + 1;
              uVar5 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              if ((int)((uVar5 ^ 0x1f) + (int)uVar18 * 3 + -0x1e) < (int)(uVar19 + 4) * 3) {
                sVar6 = 0;
                uVar18 = uVar19 + 4;
                local_a0 = piVar3;
              }
            }
LAB_00163d5c:
            local_a8 = 99999999;
            uVar5 = local_88->searchLength - 5;
            UVar10 = 4;
            if (uVar5 < 3) {
              UVar10 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
            }
            sVar8 = ZSTD_BtFindBestMatch
                              (local_60,local_88,(BYTE *)piVar3,(BYTE *)local_98,&local_a8,UVar10);
            if (sVar8 < 4) {
LAB_00163dd5:
              if (local_90 <= piVar3) break;
              piVar3 = (int *)((long)piVar21 + 2);
              if (sVar6 == 0) {
                sVar6 = 0;
              }
              else if ((local_ac != 0) && (*piVar3 == *(int *)((long)piVar3 + local_68))) {
                puVar2 = (ulong *)((long)piVar21 + 6);
                puVar7 = (ulong *)((long)piVar21 + local_68 + 6);
                puVar11 = puVar2;
                if (puVar2 < puVar1) {
                  if (*puVar7 == *puVar2) {
                    puVar11 = (ulong *)((long)piVar21 + 0xe);
                    do {
                      if (puVar1 <= puVar11) {
                        puVar7 = (ulong *)(local_68 + (long)puVar11);
                        goto LAB_00163e71;
                      }
                      puVar7 = (ulong *)((long)puVar11 + local_68);
                      uVar19 = *puVar11;
                      puVar11 = puVar11 + 1;
                    } while (*puVar7 == uVar19);
                    uVar19 = uVar19 ^ *puVar7;
                    uVar13 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    puVar11 = (ulong *)((long)puVar11 + ((uVar13 >> 3 & 0x1fffffff) - 8));
                    goto LAB_00163eb5;
                  }
                  uVar13 = *puVar2 ^ *puVar7;
                  uVar19 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
                else {
LAB_00163e71:
                  if ((puVar11 < local_70) && ((int)*puVar7 == (int)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 4);
                    puVar7 = (ulong *)((long)puVar7 + 4);
                  }
                  if ((puVar11 < local_78) && ((short)*puVar7 == (short)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 2);
                    puVar7 = (ulong *)((long)puVar7 + 2);
                  }
                  if (puVar11 < local_98) {
                    puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar7 == (BYTE)*puVar11));
                  }
LAB_00163eb5:
                  uVar19 = (long)puVar11 - (long)puVar2;
                  if (0xfffffffffffffffb < uVar19) goto LAB_00163eea;
                }
                uVar9 = (int)sVar6 + 1;
                uVar5 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)uVar18 * 4 + -0x1e) < (int)(uVar19 + 4) * 4) {
                  sVar6 = 0;
                  uVar18 = uVar19 + 4;
                  local_a0 = piVar3;
                }
              }
LAB_00163eea:
              local_a8 = 99999999;
              uVar5 = local_88->searchLength - 5;
              UVar10 = 4;
              if (uVar5 < 3) {
                UVar10 = *(U32 *)(&DAT_0019a5b0 + (ulong)uVar5 * 4);
              }
              sVar8 = ZSTD_BtFindBestMatch
                                (local_60,local_88,(BYTE *)piVar3,(BYTE *)local_98,&local_a8,UVar10)
              ;
              if (sVar8 < 4) break;
              uVar9 = (int)sVar6 + 1;
              uVar5 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar9 = (int)local_a8 + 1;
              iVar4 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)sVar8 * 4 - iVar4 <= (int)((uVar5 ^ 0x1f) + (int)uVar18 * 4 + -0x18)) break;
            }
            else {
              uVar9 = (int)sVar6 + 1;
              uVar5 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar9 = (int)local_a8 + 1;
              iVar4 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)sVar8 * 4 - iVar4 <= (int)((uVar5 ^ 0x1f) + (int)uVar18 * 4 + -0x1b))
              goto LAB_00163dd5;
            }
            local_a0 = piVar3;
            uVar18 = sVar8;
            sVar6 = local_a8;
            piVar21 = local_a0;
          } while (local_a0 < local_90);
        }
        if (sVar6 == 0) {
          UVar10 = 1;
          uVar5 = local_ac;
          local_ac = local_7c;
        }
        else {
          if ((src < local_a0) && (local_38 < (BYTE *)((long)local_a0 + (2 - sVar6)))) {
            piVar21 = local_a0;
            while (local_a0 = piVar21,
                  *(BYTE *)((long)piVar21 + -1) == *(BYTE *)((long)piVar21 + (1 - sVar6))) {
              local_a0 = (int *)((long)piVar21 + -1);
              uVar18 = uVar18 + 1;
              if ((local_a0 <= src) ||
                 (pBVar14 = (BYTE *)((long)piVar21 + (1 - sVar6)), piVar21 = local_a0,
                 pBVar14 <= local_38)) break;
            }
          }
          UVar10 = (int)sVar6 + 1;
          uVar5 = (int)sVar6 - 2;
        }
        uVar19 = (ulong)local_ac;
        uVar13 = (long)local_a0 - (long)src;
        pBVar15 = local_48->lit;
        pBVar14 = pBVar15 + uVar13;
        do {
          *(undefined8 *)pBVar15 = *src;
          pBVar15 = pBVar15 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar15 < pBVar14);
        local_48->lit = local_48->lit + uVar13;
        if (uVar13 < 0x10000) {
          psVar16 = local_48->sequences;
        }
        else {
          local_48->longLengthID = 1;
          psVar16 = local_48->sequences;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_48->sequencesStart) >> 3);
        }
        psVar16->litLength = (U16)uVar13;
        psVar16->offset = UVar10;
        if (0xffff < uVar18 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_48->sequencesStart) >> 3);
        }
        psVar16->matchLength = (U16)(uVar18 - 3);
        local_48->sequences = psVar16 + 1;
        piVar21 = (int *)((long)local_a0 + uVar18);
        bVar22 = local_ac != 0;
        src = piVar21;
        local_ac = uVar5;
        if ((bVar22) && (piVar21 <= local_90)) {
          uVar13 = (ulong)uVar5;
          while( true ) {
            uVar18 = uVar13;
            uVar13 = uVar19;
            src = piVar21;
            uVar19 = uVar13;
            local_ac = (uint)uVar18;
            if (*piVar21 != *(int *)((long)piVar21 - uVar13)) break;
            lVar12 = -uVar13;
            puVar2 = (ulong *)(piVar21 + 1);
            puVar11 = (ulong *)((long)piVar21 + lVar12 + 4);
            puVar7 = puVar2;
            if (puVar2 < puVar1) {
              if (*puVar11 == *puVar2) {
                lVar17 = 0;
                do {
                  puVar7 = (ulong *)((long)piVar21 + lVar17 + 0xc);
                  if (puVar1 <= puVar7) {
                    puVar11 = (ulong *)((long)piVar21 + lVar12 + lVar17 + 0xc);
                    puVar7 = (ulong *)((long)piVar21 + lVar17 + 0xc);
                    goto LAB_0016413f;
                  }
                  uVar19 = *(ulong *)((long)piVar21 + lVar17 + lVar12 + 0xc);
                  uVar20 = *puVar7;
                  lVar17 = lVar17 + 8;
                } while (uVar19 == uVar20);
                uVar20 = uVar20 ^ uVar19;
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar17;
              }
              else {
                uVar20 = *puVar2 ^ *puVar11;
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = uVar19 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0016413f:
              if ((puVar7 < local_70) && ((int)*puVar11 == (int)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 4);
                puVar11 = (ulong *)((long)puVar11 + 4);
              }
              if ((puVar7 < local_78) && ((short)*puVar11 == (short)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 2);
                puVar11 = (ulong *)((long)puVar11 + 2);
              }
              if (puVar7 < local_98) {
                puVar7 = (ulong *)((long)puVar7 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar7));
              }
              uVar19 = (long)puVar7 - (long)puVar2;
            }
            *(undefined8 *)local_48->lit = *(undefined8 *)piVar21;
            psVar16 = local_48->sequences;
            psVar16->litLength = 0;
            psVar16->offset = 1;
            if (0xffff < uVar19 + 1) {
              local_48->longLengthID = 2;
              local_48->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)local_48->sequencesStart) >> 3);
            }
            psVar16->matchLength = (U16)(uVar19 + 1);
            local_48->sequences = psVar16 + 1;
            piVar21 = (int *)((long)piVar21 + uVar19 + 4);
            src = piVar21;
            uVar19 = uVar18;
            local_ac = (uint)uVar13;
            if (((uint)uVar18 == 0) || (local_90 < piVar21)) break;
          }
        }
      }
      uVar5 = (uint)uVar19;
    } while (piVar21 < local_90);
  }
  uVar9 = 0;
  if (local_50 < local_4c) {
    uVar9 = local_4c;
  }
  if (local_50 < local_54) {
    uVar9 = local_54;
  }
  if (local_ac == 0) {
    local_ac = uVar9;
  }
  if (uVar5 != 0) {
    uVar9 = uVar5;
  }
  *local_40 = local_ac;
  local_40[1] = uVar9;
  return (long)local_98 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}